

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O3

bool __thiscall cmParseBlanketJSCoverage::JSONParser::ParseFile(JSONParser *this,string *file)

{
  bool bVar1;
  byte bVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  mapped_type *pmVar8;
  uint uVar9;
  FileLinesType localCoverageVector;
  string result;
  string line;
  string filename;
  string covResult;
  ifstream in;
  vector<int,_std::allocator<int>_> local_348;
  JSONParser *local_328;
  uint local_31c;
  string local_318;
  string local_2f8;
  key_type local_2d8;
  string local_2b8;
  string local_298;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  int local_258;
  undefined4 uStack_254;
  long local_248 [2];
  long local_238 [4];
  uint auStack_218 [122];
  
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_328 = this;
  std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in);
  uVar9 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar9 & 5) != 0) {
LAB_0028b8c1:
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                               local_2f8.field_2._M_local_buf[0]) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (uVar9 & 5) == 0;
  }
  bVar1 = false;
  local_31c = uVar9;
  do {
    bVar2 = 0;
    while( true ) {
      bVar5 = cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_2f8,(bool *)0x0,-1);
      if (!bVar5) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](&local_328->Coverage->TotalCoverage,&local_2d8);
        std::vector<int,_std::allocator<int>_>::operator=(pmVar8,&local_348);
        uVar9 = local_31c;
        if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        goto LAB_0028b8c1;
      }
      lVar7 = std::__cxx11::string::find((char *)&local_2f8,0x5c53e4,0);
      if (lVar7 != -1) break;
      lVar7 = std::__cxx11::string::find((char *)&local_2f8,0x585173,0);
      if ((bool)(bVar1 & bVar2 & lVar7 != -1)) {
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_2f8._M_dataplus._M_p,
                   local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
        getValue(&local_318,local_328,&local_298,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_318);
        std::__cxx11::string::operator=((string *)&local_318,(string *)&local_258);
        if ((long *)CONCAT44(uStack_254,local_258) != local_248) {
          operator_delete((long *)CONCAT44(uStack_254,local_258),local_248[0] + 1);
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_318);
        if (iVar6 == 0) {
          local_258 = -1;
          if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = -1;
            goto LAB_0028b748;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_348,
                     (iterator)
                     local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_258);
        }
        else {
          local_258 = atoi(local_318._M_dataplus._M_p);
          if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_348,
                       (iterator)
                       local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_258);
          }
          else {
            *local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_258;
LAB_0028b748:
            local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        bVar2 = 1;
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)&local_2f8,0x588d7b,0);
        bVar2 = bVar2 | lVar7 != -1;
      }
    }
    if (bVar1) {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&local_328->Coverage->TotalCoverage,&local_2d8);
      std::vector<int,_std::allocator<int>_>::operator=(pmVar8,&local_348);
      if (local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,local_2f8._M_dataplus._M_p,
               local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
    getValue(&local_318,local_328,&local_2b8,0);
    sVar4 = local_2d8._M_string_length;
    _Var3._M_p = local_318._M_dataplus._M_p;
    strlen(local_318._M_dataplus._M_p);
    std::__cxx11::string::_M_replace((ulong)&local_2d8,0,(char *)sVar4,(ulong)_Var3._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    bVar1 = true;
  } while( true );
}

Assistant:

bool ParseFile(std::string file)
    {
    FileLinesType localCoverageVector;
    std::string filename;
    bool foundFile = false;
    bool inSource  = false;
    std::string covResult;
    std::string line;

    cmsys::ifstream in(file.c_str());
    if(!in)
      {
      return false;
      }
    while(  cmSystemTools::GetLineFromStream(in, line))
      {
      if(line.find("filename") != line.npos)
        {
        if(foundFile)
          {
          /*
          * Upon finding a second file name, generate a
          * vector within the total coverage to capture the
          * information in the local vector
          */
          FileLinesType& CoverageVector =
              this->Coverage.TotalCoverage[filename];
          CoverageVector = localCoverageVector;
          localCoverageVector.clear();
          }
        foundFile= true;
        inSource = false;
        filename = getValue(line,0).c_str();
        }
      else if((line.find("coverage") != line.npos) && foundFile && inSource )
        {
        /*
        *  two types of "coverage" in the JSON structure
        *
        *  The coverage result over the file or set of files
        *  and the coverage for each individual line
        *
        *  FoundFile and foundSource ensure that
        *  only the value of the line coverage is captured
        */
        std::string result = getValue(line,1);
        result = result.substr(2,result.npos);
        if(result == "\"\"")
          {
          // Empty quotation marks indicate that the
          // line is not executable
          localCoverageVector.push_back(-1);
          }
        else
          {
          // Else, it contains the number of time executed
          localCoverageVector.push_back(atoi(result.c_str()));
          }
        }
      else if(line.find("source") != line.npos)
        {
        inSource=true;
        }
      }

    // On exit, capture end of last file covered.
    FileLinesType& CoverageVector =
        this->Coverage.TotalCoverage[filename];
    CoverageVector = localCoverageVector;
    localCoverageVector.clear();
    return true;
    }